

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int256_t.hpp
# Opt level: O1

int256_t * __thiscall
primesum::int256_t::operator*(int256_t *__return_storage_ptr__,int256_t *this,int256_t *other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined8 local_40;
  ulong local_38;
  
  uVar1 = (ulong)this->low;
  uVar2 = *(ulong *)((long)&this->low + 8);
  uVar3 = (ulong)other->low;
  uVar4 = *(ulong *)((long)&other->low + 8);
  if (uVar2 == 0 && uVar4 == 0) {
    uVar5 = (ulong)this->high;
    lVar25 = *(long *)((long)&this->high + 8);
    lVar30 = lVar25 + (ulong)(0xfffffffffffffffe < uVar5);
    if (lVar30 == 0 && (ulong)(1 < uVar5 + 1) <= (ulong)-lVar30) {
      uVar6 = (ulong)other->high;
      lVar30 = *(long *)((long)&other->high + 8);
      lVar29 = lVar30 + (ulong)(0xfffffffffffffffe < uVar6);
      if (lVar29 == 0 && (ulong)(1 < uVar6 + 1) <= (ulong)-lVar29) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar3;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar1;
        lVar25 = -(ulong)(lVar25 != lVar30 || uVar5 != uVar6);
        *(long *)&__return_storage_ptr__->low = SUB168(auVar7 * auVar14,0);
        *(ulong *)((long)&__return_storage_ptr__->low + 8) =
             uVar4 * uVar1 + uVar3 * uVar2 + SUB168(auVar7 * auVar14,8);
        *(long *)((long)&__return_storage_ptr__->high + 8) = lVar25;
        *(long *)&__return_storage_ptr__->high = lVar25;
        return __return_storage_ptr__;
      }
    }
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  uVar26 = SUB168(auVar9 * auVar16,8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar2;
  uVar27 = SUB168(auVar10 * auVar17,8);
  uVar21 = SUB168(auVar10 * auVar17,0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar4;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar2;
  uVar22 = SUB168(auVar11 * auVar18,0);
  uVar5 = (ulong)other->high;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1;
  uVar23 = SUB168(auVar12 * auVar19,0);
  uVar6 = (ulong)this->high;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar6;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  uVar24 = SUB168(auVar13 * auVar20,0);
  uVar28 = SUB168(auVar9 * auVar16,0) + uVar21;
  uVar31 = uVar22 + uVar26;
  uVar32 = uVar31 + uVar27;
  uVar21 = (ulong)(uVar28 < uVar21);
  uVar33 = uVar32 + uVar21;
  uVar34 = uVar33 + uVar23;
  uVar35 = uVar34 + uVar24;
  lVar25 = SUB168(auVar11 * auVar18,8) + (ulong)CARRY8(uVar22,uVar26) + (ulong)CARRY8(uVar31,uVar27)
           + (ulong)CARRY8(uVar32,uVar21) +
           uVar1 * *(long *)((long)&other->high + 8) + SUB168(auVar12 * auVar19,8) + uVar2 * uVar5 +
           (ulong)CARRY8(uVar33,uVar23) +
           *(long *)((long)&this->high + 8) * uVar3 + SUB168(auVar13 * auVar20,8) + uVar4 * uVar6 +
           (ulong)CARRY8(uVar34,uVar24);
  *(ulong *)&__return_storage_ptr__->high = uVar35;
  *(long *)((long)&__return_storage_ptr__->high + 8) = lVar25;
  local_40 = SUB168(auVar8 * auVar15,0);
  *(undefined8 *)&__return_storage_ptr__->low = local_40;
  local_38 = SUB168(auVar8 * auVar15,8);
  *(ulong *)((long)&__return_storage_ptr__->low + 8) = uVar28 + local_38;
  if (CARRY8(uVar28,local_38)) {
    *(ulong *)&__return_storage_ptr__->high = uVar35 + 1;
    *(ulong *)((long)&__return_storage_ptr__->high + 8) =
         lVar25 + (ulong)(0xfffffffffffffffe < uVar35);
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t operator*(const int256_t& other) const
    {
        auto max64 = prt::numeric_limits<std::uint64_t>::max();

        if (low <= max64 &&
            other.low <= max64 &&
            ((high == 0 || ~high == 0) &&
             (other.high == 0 || ~other.high == 0)))
        {
          return int256_t(low * other.low,
                          (high == other.high) ? 0 : -1);
        }
        else
        {
            auto al = low & max64;
            auto ah = low >> 64;
            auto bl = other.low & max64;
            auto bh = other.low >> 64;

            auto x = al * bl;
            auto y = al * bh;
            auto z = ah * bl;
            auto w = ah * bh;

            return int256_t(y << 64, y >> 64) +
                   int256_t(z << 64, z >> 64) +
                   int256_t(x, w + low * other.high + high * other.low);
        }
    }